

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::ComputeCurrentValue
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  _Atomic_word *p_Var2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*> *__tmp;
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    p_Var2 = (_Atomic_word *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,_testing::internal::ParamIterator<const_char_*>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<google::protobuf::descriptor_unittest::DescriptorPoolMode>_*,_false>
                         + 0x28))();
    puVar3 = (undefined8 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,_testing::internal::ParamIterator<const_char_*>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<const_char_*>_>
                                   .
                                   super__Head_base<1UL,_testing::internal::ParamIterator<const_char_*>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
                         + 0x28))();
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    *(undefined1 **)&p_Var4->_M_use_count = &DAT_100000001;
    p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_018e2788;
    p_Var4[1]._vptr__Sp_counted_base = (_func_int **)*puVar3;
    p_Var4[1]._M_use_count = *p_Var2;
    (this->current_value_).
    super___shared_ptr<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var4 + 1);
    this_00 = (this->current_value_).
              super___shared_ptr<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->current_value_).
    super___shared_ptr<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }